

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O3

void ztparseInit(void *yypRawParser,ztparseinfo_t *info)

{
  *(ztparseinfo_t **)((long)yypRawParser + 0x10) = info;
  *(undefined4 *)((long)yypRawParser + 8) = 0xffffffff;
  *(long *)yypRawParser = (long)yypRawParser + 0x18;
  *(undefined2 *)((long)yypRawParser + 0x18) = 0;
  *(long *)((long)yypRawParser + 0x658) = (long)yypRawParser + 0x648;
  return;
}

Assistant:

void ztparseInit(void *yypRawParser ztparseCTX_PDECL){
  yyParser *yypParser = (yyParser*)yypRawParser;
  ztparseCTX_STORE
#ifdef YYTRACKMAXSTACKDEPTH
  yypParser->yyhwm = 0;
#endif
#if YYSTACKDEPTH<=0
  yypParser->yytos = NULL;
  yypParser->yystack = NULL;
  yypParser->yystksz = 0;
  if( yyGrowStack(yypParser) ){
    yypParser->yystack = &yypParser->yystk0;
    yypParser->yystksz = 1;
  }
#endif
#ifndef YYNOERRORRECOVERY
  yypParser->yyerrcnt = -1;
#endif
  yypParser->yytos = yypParser->yystack;
  yypParser->yystack[0].stateno = 0;
  yypParser->yystack[0].major = 0;
#if YYSTACKDEPTH>0
  yypParser->yystackEnd = &yypParser->yystack[YYSTACKDEPTH-1];
#endif
}